

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O2

int secp256k1_fe_sqrt(secp256k1_fe *r,secp256k1_fe *a)

{
  int iVar1;
  bool bVar2;
  secp256k1_fe x44;
  secp256k1_fe x22;
  secp256k1_fe x3;
  secp256k1_fe t1;
  secp256k1_fe x88;
  secp256k1_fe x11;
  secp256k1_fe x2;
  secp256k1_fe x223;
  secp256k1_fe x220;
  secp256k1_fe x176;
  secp256k1_fe x9;
  secp256k1_fe x6;
  secp256k1_fe local_58;
  
  secp256k1_fe_sqr(&x2,a);
  secp256k1_fe_mul(&x2,&x2,a);
  secp256k1_fe_sqr(&x3,&x2);
  secp256k1_fe_mul(&x3,&x3,a);
  x6.n[4] = x3.n[4];
  x6.n[2] = x3.n[2];
  x6.n[3] = x3.n[3];
  x6.n[0] = x3.n[0];
  x6.n[1] = x3.n[1];
  iVar1 = 3;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    secp256k1_fe_sqr(&x6,&x6);
  }
  secp256k1_fe_mul(&x6,&x6,&x3);
  x9.n[4] = x6.n[4];
  x9.n[2] = x6.n[2];
  x9.n[3] = x6.n[3];
  x9.n[0] = x6.n[0];
  x9.n[1] = x6.n[1];
  iVar1 = 3;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    secp256k1_fe_sqr(&x9,&x9);
  }
  secp256k1_fe_mul(&x9,&x9,&x3);
  x11.n[4] = x9.n[4];
  x11.n[2] = x9.n[2];
  x11.n[3] = x9.n[3];
  x11.n[0] = x9.n[0];
  x11.n[1] = x9.n[1];
  iVar1 = 2;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    secp256k1_fe_sqr(&x11,&x11);
  }
  secp256k1_fe_mul(&x11,&x11,&x2);
  x22.n[4] = x11.n[4];
  x22.n[2] = x11.n[2];
  x22.n[3] = x11.n[3];
  x22.n[0] = x11.n[0];
  x22.n[1] = x11.n[1];
  iVar1 = 0xb;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    secp256k1_fe_sqr(&x22,&x22);
  }
  secp256k1_fe_mul(&x22,&x22,&x11);
  x44.n[4] = x22.n[4];
  x44.n[2] = x22.n[2];
  x44.n[3] = x22.n[3];
  x44.n[0] = x22.n[0];
  x44.n[1] = x22.n[1];
  iVar1 = 0x16;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    secp256k1_fe_sqr(&x44,&x44);
  }
  secp256k1_fe_mul(&x44,&x44,&x22);
  x88.n[4] = x44.n[4];
  x88.n[2] = x44.n[2];
  x88.n[3] = x44.n[3];
  x88.n[0] = x44.n[0];
  x88.n[1] = x44.n[1];
  iVar1 = 0x2c;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    secp256k1_fe_sqr(&x88,&x88);
  }
  secp256k1_fe_mul(&x88,&x88,&x44);
  x176.n[4] = x88.n[4];
  x176.n[2] = x88.n[2];
  x176.n[3] = x88.n[3];
  x176.n[0] = x88.n[0];
  x176.n[1] = x88.n[1];
  iVar1 = 0x58;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    secp256k1_fe_sqr(&x176,&x176);
  }
  secp256k1_fe_mul(&x176,&x176,&x88);
  x220.n[4] = x176.n[4];
  x220.n[2] = x176.n[2];
  x220.n[3] = x176.n[3];
  x220.n[0] = x176.n[0];
  x220.n[1] = x176.n[1];
  iVar1 = 0x2c;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    secp256k1_fe_sqr(&x220,&x220);
  }
  secp256k1_fe_mul(&x220,&x220,&x44);
  x223.n[4] = x220.n[4];
  x223.n[2] = x220.n[2];
  x223.n[3] = x220.n[3];
  x223.n[0] = x220.n[0];
  x223.n[1] = x220.n[1];
  iVar1 = 3;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    secp256k1_fe_sqr(&x223,&x223);
  }
  secp256k1_fe_mul(&x223,&x223,&x3);
  t1.n[4] = x223.n[4];
  t1.n[2] = x223.n[2];
  t1.n[3] = x223.n[3];
  t1.n[0] = x223.n[0];
  t1.n[1] = x223.n[1];
  iVar1 = 0x17;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    secp256k1_fe_sqr(&t1,&t1);
  }
  secp256k1_fe_mul(&t1,&t1,&x22);
  iVar1 = 6;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    secp256k1_fe_sqr(&t1,&t1);
  }
  secp256k1_fe_mul(&t1,&t1,&x2);
  secp256k1_fe_sqr(&t1,&t1);
  secp256k1_fe_sqr(r,&t1);
  secp256k1_fe_sqr(&t1,r);
  local_58.n[0] = 0x3ffffbfffff0bc - t1.n[0];
  local_58.n[1] = 0x3ffffffffffffc - t1.n[1];
  local_58.n[2] = 0x3ffffffffffffc - t1.n[2];
  local_58.n[3] = 0x3ffffffffffffc - t1.n[3];
  local_58.n[4] = 0x3fffffffffffc - t1.n[4];
  secp256k1_fe_add(&local_58,a);
  iVar1 = secp256k1_fe_normalizes_to_zero(&local_58);
  return iVar1;
}

Assistant:

static int secp256k1_fe_sqrt(secp256k1_fe *r, const secp256k1_fe *a) {
    /** Given that p is congruent to 3 mod 4, we can compute the square root of
     *  a mod p as the (p+1)/4'th power of a.
     *
     *  As (p+1)/4 is an even number, it will have the same result for a and for
     *  (-a). Only one of these two numbers actually has a square root however,
     *  so we test at the end by squaring and comparing to the input.
     *  Also because (p+1)/4 is an even number, the computed square root is
     *  itself always a square (a ** ((p+1)/4) is the square of a ** ((p+1)/8)).
     */
    secp256k1_fe x2, x3, x6, x9, x11, x22, x44, x88, x176, x220, x223, t1;
    int j;

    VERIFY_CHECK(r != a);

    /** The binary representation of (p + 1)/4 has 3 blocks of 1s, with lengths in
     *  { 2, 22, 223 }. Use an addition chain to calculate 2^n - 1 for each block:
     *  1, [2], 3, 6, 9, 11, [22], 44, 88, 176, 220, [223]
     */

    secp256k1_fe_sqr(&x2, a);
    secp256k1_fe_mul(&x2, &x2, a);

    secp256k1_fe_sqr(&x3, &x2);
    secp256k1_fe_mul(&x3, &x3, a);

    x6 = x3;
    for (j=0; j<3; j++) {
        secp256k1_fe_sqr(&x6, &x6);
    }
    secp256k1_fe_mul(&x6, &x6, &x3);

    x9 = x6;
    for (j=0; j<3; j++) {
        secp256k1_fe_sqr(&x9, &x9);
    }
    secp256k1_fe_mul(&x9, &x9, &x3);

    x11 = x9;
    for (j=0; j<2; j++) {
        secp256k1_fe_sqr(&x11, &x11);
    }
    secp256k1_fe_mul(&x11, &x11, &x2);

    x22 = x11;
    for (j=0; j<11; j++) {
        secp256k1_fe_sqr(&x22, &x22);
    }
    secp256k1_fe_mul(&x22, &x22, &x11);

    x44 = x22;
    for (j=0; j<22; j++) {
        secp256k1_fe_sqr(&x44, &x44);
    }
    secp256k1_fe_mul(&x44, &x44, &x22);

    x88 = x44;
    for (j=0; j<44; j++) {
        secp256k1_fe_sqr(&x88, &x88);
    }
    secp256k1_fe_mul(&x88, &x88, &x44);

    x176 = x88;
    for (j=0; j<88; j++) {
        secp256k1_fe_sqr(&x176, &x176);
    }
    secp256k1_fe_mul(&x176, &x176, &x88);

    x220 = x176;
    for (j=0; j<44; j++) {
        secp256k1_fe_sqr(&x220, &x220);
    }
    secp256k1_fe_mul(&x220, &x220, &x44);

    x223 = x220;
    for (j=0; j<3; j++) {
        secp256k1_fe_sqr(&x223, &x223);
    }
    secp256k1_fe_mul(&x223, &x223, &x3);

    /* The final result is then assembled using a sliding window over the blocks. */

    t1 = x223;
    for (j=0; j<23; j++) {
        secp256k1_fe_sqr(&t1, &t1);
    }
    secp256k1_fe_mul(&t1, &t1, &x22);
    for (j=0; j<6; j++) {
        secp256k1_fe_sqr(&t1, &t1);
    }
    secp256k1_fe_mul(&t1, &t1, &x2);
    secp256k1_fe_sqr(&t1, &t1);
    secp256k1_fe_sqr(r, &t1);

    /* Check that a square root was actually calculated */

    secp256k1_fe_sqr(&t1, r);
    return secp256k1_fe_equal(&t1, a);
}